

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Timing.cpp
# Opt level: O2

void __thiscall soul::ScopedTimer::~ScopedTimer(ScopedTimer *this)

{
  bool bVar1;
  double __x;
  string asStack_48 [32];
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  bVar1 = Logger::isLoggingEnabled();
  if (bVar1) {
    __x = (double)std::__cxx11::string::string(asStack_48,(string *)this);
    local_28._8_8_ = 0;
    local_10 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/diagnostics/soul_Timing.cpp:40:5)>
               ::_M_invoke;
    local_18 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/diagnostics/soul_Timing.cpp:40:5)>
               ::_M_manager;
    local_28._M_unused._M_object = this;
    Logger::log((Logger *)asStack_48,__x);
    std::_Function_base::~_Function_base((_Function_base *)&local_28);
    std::__cxx11::string::~string(asStack_48);
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

ScopedTimer::~ScopedTimer()
{
    SOUL_LOG (description, [&] { return getElapsedTimeDescription(); });
}